

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_import_free(lysf_ctx *ctx,lysp_import *import)

{
  lysp_ext_instance *plVar1;
  lysp_ext_instance *plVar2;
  lysp_ext_instance *plVar3;
  long lVar4;
  
  lydict_remove(ctx->ctx,import->name);
  lydict_remove(ctx->ctx,import->prefix);
  lydict_remove(ctx->ctx,import->dsc);
  lydict_remove(ctx->ctx,import->ref);
  lVar4 = 0;
  plVar3 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = import->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar2 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar2 = plVar1[-1].exts;
    }
    if (plVar2 <= plVar3) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar4));
    plVar3 = (lysp_ext_instance *)((long)&plVar3->name + 1);
    lVar4 = lVar4 + 0x70;
  }
  if (plVar1 != (lysp_ext_instance *)0x0) {
    free(&plVar1[-1].exts);
    return;
  }
  return;
}

Assistant:

static void
lysp_import_free(struct lysf_ctx *ctx, struct lysp_import *import)
{
    /* imported module is freed directly from the context's list */
    lydict_remove(ctx->ctx, import->name);
    lydict_remove(ctx->ctx, import->prefix);
    lydict_remove(ctx->ctx, import->dsc);
    lydict_remove(ctx->ctx, import->ref);
    FREE_ARRAY(ctx, import->exts, lysp_ext_instance_free);
}